

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O2

bool __thiscall
IMLE<1,_1,_FastLinearExpert>::load(IMLE<1,_1,_FastLinearExpert> *this,string *filename)

{
  char cVar1;
  text_iarchive archive;
  ifstream fs;
  
  std::ifstream::ifstream(&fs,(filename->_M_dataplus)._M_p,_S_in);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&archive,
                   "IMLE: Could not open file ",filename);
    message(this,(string *)&archive);
    std::__cxx11::string::_M_dispose();
  }
  else {
    boost::archive::text_iarchive::text_iarchive(&archive,(istream *)&fs,0);
    reset(this);
    boost::archive::detail::load_non_pointer_type<boost::archive::text_iarchive>::load_standard::
    invoke<IMLE<1,1,FastLinearExpert>>(&archive,this);
    std::ifstream::close();
    boost::archive::text_iarchive_impl<boost::archive::text_iarchive>::~text_iarchive_impl
              (&archive.super_text_iarchive_impl<boost::archive::text_iarchive>);
  }
  std::ifstream::~ifstream(&fs);
  return (bool)cVar1;
}

Assistant:

IMLE_CLASS_TEMPLATE
bool IMLE_base::load(std::string const &filename)
{
    std::ifstream fs(filename.c_str());
	if( !fs.is_open() )
	{
		message(OPENERR + filename);
		return false;
	}
    boost::archive::text_iarchive archive(fs);

    reset();
	archive & (*this);
    fs.close();

    return true;
}